

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::create(Mapper *this)

{
  Module *module;
  Map *map;
  void *this_00;
  long in_RSI;
  _Any_data local_50;
  _Manager_type local_40;
  
  module = *(Module **)(in_RSI + 0x108);
  map = *(Map **)(in_RSI + 0x110);
  this_00 = operator_new(0x138);
  std::
  function<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&)>
  ::function((function<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&)>
              *)&local_50,
             (function<void_(wasm::Function_*,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_&)>
              *)(in_RSI + 0x118));
  ParallelFunctionAnalysis<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::
  Type>,std::allocator<wasm::Type>>,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::unordered_set<wasm
  ::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>&)>)::Mapper::
  Mapper(wasm::Module&,std::map<wasm::Function*,std::unordered_set<wasm::Type,std::hash<wasm::
  Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>,std::less<wasm::Function*>,std::
  allocator<std::pair<wasm::Function*const,std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::
  equal_to<wasm::Type>,std::allocator<wasm::Type>>>>>&,std::function<void(wasm::Function*,std::
  unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::
  Type>_>__>_(this_00,module,map,(Func *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  *(void **)this = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }